

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

void __thiscall rw::ColorQuant::reduceNode(ColorQuant *this,Node *node)

{
  int local_1c;
  int i;
  Node *node_local;
  ColorQuant *this_local;
  
  for (local_1c = 0; local_1c < 0x10; local_1c = local_1c + 1) {
    if (node->children[local_1c] != (Node *)0x0) {
      node->r = node->children[local_1c]->r + node->r;
      node->g = node->children[local_1c]->g + node->g;
      node->b = node->children[local_1c]->b + node->b;
      node->a = node->children[local_1c]->a + node->a;
      node->numPixels = node->children[local_1c]->numPixels + node->numPixels;
      Node::destroy(node->children[local_1c]);
      node->children[local_1c] = (Node *)0x0;
    }
  }
  LinkList::append(&this->leaves,&node->link);
  return;
}

Assistant:

void
ColorQuant::reduceNode(Node *node)
{
	int i;
	assert(node->numPixels == 0);
	for(i = 0; i < 16; i++)
		if(node->children[i]){
			node->r += node->children[i]->r;
			node->g += node->children[i]->g;
			node->b += node->children[i]->b;
			node->a += node->children[i]->a;
			node->numPixels += node->children[i]->numPixels;
			node->children[i]->destroy();
			node->children[i] = nil;
		}
	assert(node->link.next == nil);
	assert(node->link.prev == nil);
	this->leaves.append(&node->link);
}